

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O1

bool __thiscall spvtools::opt::MemPass::RemoveUnreachableBlocks(MemPass *this,Function *func)

{
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *pvVar1;
  undefined8 uVar2;
  char cVar3;
  size_type sVar4;
  bool bVar5;
  pointer puVar6;
  BasicBlock *pBVar7;
  BasicBlock *pBVar8;
  __node_gen_type __node_gen;
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  worklist;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  reachable_blocks;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  visited_blocks;
  _Any_data local_158;
  code *local_148;
  code *pcStack_140;
  Function *local_130;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_128;
  MemPass *pMStack_120;
  code *local_118;
  code *pcStack_110;
  pointer local_108;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_100;
  _Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_f8;
  undefined1 local_a0 [40];
  Instruction *local_78;
  Instruction *pIStack_70;
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_a0._0_8_ = (long)local_a0 + 0x30;
  local_a0._8_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x1;
  local_a0._16_8_ = (_Hash_node_base *)0x0;
  local_a0._24_8_ = (pointer)0x0;
  local_a0._32_4_ = 1.0;
  local_78 = (Instruction *)0x0;
  pIStack_70 = (Instruction *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  _M_initialize_map(&local_f8,0);
  local_128._M_head_impl =
       *(BasicBlock **)
        &(((func->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t;
  local_158._M_unused._M_object = local_a0;
  std::
  _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<spvtools::opt::BasicBlock*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
            ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)local_158._M_unused._0_8_,&local_128,&local_158);
  local_158._M_unused._0_8_ =
       (undefined8)
       (((func->blocks_).
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t;
  local_130 = func;
  std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>::
  emplace_back<spvtools::opt::BasicBlock*>
            ((deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>> *)
             &local_f8,(BasicBlock **)&local_158);
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      pBVar7 = *local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_f8._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_f8._M_impl.super__Deque_impl_data._M_start._M_last =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_first =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_f8._M_impl.super__Deque_impl_data._M_start._M_node =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_f8._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      local_148 = (code *)0x0;
      pcStack_140 = (code *)0x0;
      local_158._M_unused._M_object = (void *)0x0;
      local_158._8_8_ = 0;
      local_158._M_unused._M_object = operator_new(0x20);
      *(undefined1 **)local_158._M_unused._0_8_ = local_a0;
      *(_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        **)((long)local_158._M_unused._0_8_ + 8) = &local_68;
      *(_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> **)
       ((long)local_158._M_unused._0_8_ + 0x10) = &local_f8;
      *(MemPass **)((long)local_158._M_unused._0_8_ + 0x18) = this;
      pcStack_140 = std::
                    _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                    ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_manager;
      BasicBlock::ForEachSuccessorLabel(pBVar7,(function<void_(unsigned_int)> *)&local_158);
      if (local_148 != (code *)0x0) {
        (*local_148)(&local_158,&local_158,__destroy_functor);
      }
      local_148 = (code *)0x0;
      pcStack_140 = (code *)0x0;
      local_158._M_unused._M_object = (void *)0x0;
      local_158._8_8_ = 0;
      local_158._M_unused._M_object = operator_new(0x20);
      ((BasicBlock *)local_158._M_unused._0_8_)->function_ = (Function *)local_a0;
      (((BasicBlock *)local_158._M_unused._0_8_)->label_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t = (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              )&local_68;
      (((BasicBlock *)local_158._M_unused._0_8_)->insts_).
      super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList = (_func_int **)&local_f8;
      (((BasicBlock *)local_158._M_unused._0_8_)->insts_).
      super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
      super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
           (_func_int **)this;
      pcStack_140 = std::
                    _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                    ::_M_invoke;
      local_148 = std::
                  _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:429:25)>
                  ::_M_manager;
      BasicBlock::ForMergeAndContinueLabel(pBVar7,(function<void_(unsigned_int)> *)&local_158);
      if (local_148 != (code *)0x0) {
        (*local_148)(&local_158,&local_158,__destroy_functor);
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  puVar6 = (local_130->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_108 = (local_130->blocks_).
              super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != local_108) {
    do {
      pBVar7 = (puVar6->_M_t).
               super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
               .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_158._M_unused._0_8_ = (undefined8)pBVar7;
      sVar4 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a0,(key_type *)&local_158);
      if (sVar4 != 0) {
        local_128._M_head_impl = (BasicBlock *)local_a0;
        pcStack_110 = std::
                      _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:463:26)>
                      ::_M_invoke;
        local_118 = std::
                    _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/mem_pass.cpp:463:26)>
                    ::_M_manager;
        local_158._8_8_ = 0;
        local_158._M_unused._M_object = &local_128;
        pcStack_140 = std::
                      _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                      ::_M_invoke;
        local_148 = std::
                    _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h:332:7)>
                    ::_M_manager;
        pBVar7 = *(BasicBlock **)
                  ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
        pMStack_120 = this;
        if ((pBVar7 != (BasicBlock *)0x0) &&
           (*(bool *)&((Instruction *)((long)&pBVar7->insts_ + 8))->
                      super_IntrusiveNodeBase<spvtools::opt::Instruction> == false)) {
          do {
            if (pBVar7 == (BasicBlock *)0x0) break;
            pBVar8 = (BasicBlock *)
                     ((IntrusiveNodeBase<spvtools::opt::Instruction> *)&pBVar7->label_)->
                     _vptr_IntrusiveNodeBase;
            cVar3 = '\0';
            if (*(bool *)&(((Instruction *)((long)&pBVar8->insts_ + 8))->
                          super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                          _vptr_IntrusiveNodeBase != false) {
              pBVar8 = (BasicBlock *)0x0;
            }
            if (*(Op *)((long)&pBVar7->insts_ + 0x18) == OpPhi) {
              local_100._M_head_impl = pBVar7;
              if (local_148 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar3 = (*pcStack_140)(&local_158,(uint *)&local_100);
              if (cVar3 != '\0') {
                pBVar7 = pBVar8;
              }
            }
          } while (cVar3 != '\0');
        }
        if (local_148 != (code *)0x0) {
          (*local_148)(&local_158,&local_158,__destroy_functor);
        }
        if (local_118 != (code *)0x0) {
          (*local_118)(&local_128,&local_128,3);
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != local_108);
  }
  pvVar1 = &local_130->blocks_;
  local_158._8_8_ =
       (local_130->blocks_).
       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_158._M_unused._M_object = pvVar1;
  if ((pointer)local_158._8_8_ ==
      (local_130->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      uVar2 = local_158._8_8_;
      local_128._M_head_impl = *(BasicBlock **)local_158._8_8_;
      sVar4 = std::
              _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       *)local_a0,&local_128._M_head_impl);
      if (sVar4 == 0) {
        RemoveBlock(this,(iterator *)&local_158);
        bVar5 = true;
      }
      else {
        local_158._8_8_ = uVar2 + 8;
      }
    } while (((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
               *)local_158._M_unused._0_8_ != pvVar1) ||
            ((pointer)local_158._8_8_ !=
             (local_130->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish));
  }
  std::_Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~_Deque_base(&local_f8);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_a0);
  return bVar5;
}

Assistant:

bool MemPass::RemoveUnreachableBlocks(Function* func) {
  bool modified = false;

  // Mark reachable all blocks reachable from the function's entry block.
  std::unordered_set<BasicBlock*> reachable_blocks;
  std::unordered_set<BasicBlock*> visited_blocks;
  std::queue<BasicBlock*> worklist;
  reachable_blocks.insert(func->entry().get());

  // Initially mark the function entry point as reachable.
  worklist.push(func->entry().get());

  auto mark_reachable = [&reachable_blocks, &visited_blocks, &worklist,
                         this](uint32_t label_id) {
    auto successor = cfg()->block(label_id);
    if (visited_blocks.count(successor) == 0) {
      reachable_blocks.insert(successor);
      worklist.push(successor);
      visited_blocks.insert(successor);
    }
  };

  // Transitively mark all blocks reachable from the entry as reachable.
  while (!worklist.empty()) {
    BasicBlock* block = worklist.front();
    worklist.pop();

    // All the successors of a live block are also live.
    static_cast<const BasicBlock*>(block)->ForEachSuccessorLabel(
        mark_reachable);

    // All the Merge and ContinueTarget blocks of a live block are also live.
    block->ForMergeAndContinueLabel(mark_reachable);
  }

  // Update operands of Phi nodes that reference unreachable blocks.
  for (auto& block : *func) {
    // If the block is about to be removed, don't bother updating its
    // Phi instructions.
    if (reachable_blocks.count(&block) == 0) {
      continue;
    }

    // If the block is reachable and has Phi instructions, remove all
    // operands from its Phi instructions that reference unreachable blocks.
    // If the block has no Phi instructions, this is a no-op.
    block.ForEachPhiInst([&reachable_blocks, this](Instruction* phi) {
      RemovePhiOperands(phi, reachable_blocks);
    });
  }

  // Erase unreachable blocks.
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (reachable_blocks.count(&*ebi) == 0) {
      RemoveBlock(&ebi);
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}